

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

longlong __thiscall Net::automatch(Net *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  longlong lVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  replys;
  string temp;
  string reply;
  string request;
  stringstream stream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  value_type local_240;
  string local_220;
  string local_200;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  Net *local_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"AUTO ","");
  paVar1 = &local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_1e0,local_1e0 + local_1d8);
  send_with_retry(this,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  lVar7 = -1;
  if (this->closed != 0) goto LAB_00109be3;
  read_with_retry(this,&local_200);
  if (this->closed != 0) goto LAB_00109be3;
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_200,_S_out|_S_in);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_240,' ');
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    if (local_240._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_258,&local_240);
    }
  }
  lVar7 = 0;
  lVar4 = std::__cxx11::string::find
                    ((char *)local_258.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,0x10b762,0);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find
                      ((char *)local_258.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,0x10b767,0);
    if (lVar4 == -1) {
LAB_00109c92:
      this->closed = 1;
      lVar7 = -1;
    }
    else {
      this = (Net *)local_258.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      lVar7 = strtoll((char *)this,(char **)&local_1c0,10);
      if (local_1c0 == this) {
        uVar6 = std::__throw_invalid_argument("stoll");
        if (*piVar5 == 0) {
          *piVar5 = iVar2;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != paVar1) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0);
        }
        _Unwind_Resume(uVar6);
      }
      if (*piVar5 == 0) {
        *piVar5 = iVar2;
      }
      else if (*piVar5 == 0x22) {
        std::__throw_out_of_range("stoll");
        goto LAB_00109c92;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_00109be3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  return lVar7;
}

Assistant:

long long Net::automatch(){
	std::string request="AUTO ";
	std::string reply;
	send_with_retry(request);
	if(closed)return -1;
	read_with_retry(reply);
	if(closed)return -1;

	std::stringstream stream(reply);
	std::string temp;
	std::vector<std::string> replys;
	while(std::getline(stream,temp,' ')){
		if(!temp.empty()){
			replys.push_back(temp);
		}
	}
	if(replys[0].find("HOST")!=std::string::npos){
		return 0;
	} else if(replys[0].find("GUEST")!=std::string::npos) return std::stoll(replys[1]);
	closed=1;
	return -1;
}